

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteAsciiSectionHeader(FBXExporter *this,string *title)

{
  ostream *poVar1;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_200;
  string local_1f0;
  StreamWriterLE outstream;
  stringstream s;
  ostream local_188 [376];
  
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_200,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter
            (&outstream,(shared_ptr<Assimp::IOStream> *)&local_200,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = std::operator<<(local_188,"\n\n; ");
  poVar1 = std::operator<<(poVar1,(string *)title);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_188,(string *)FBX::COMMENT_UNDERLINE_abi_cxx11_);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  StreamWriter<false,_false>::PutString(&outstream,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  StreamWriter<false,_false>::~StreamWriter(&outstream);
  return;
}

Assistant:

void FBXExporter::WriteAsciiSectionHeader(const std::string& title)
{
    StreamWriterLE outstream(outfile);
    std::stringstream s;
    s << "\n\n; " << title << '\n';
    s << FBX::COMMENT_UNDERLINE << "\n";
    outstream.PutString(s.str());
}